

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O2

void __thiscall
TypeArray::TypeArray(TypeArray *this,InplaceStr name,TypeBase *subType,longlong length)

{
  TypeBase::TypeBase(&this->super_TypeBase,0x13,name);
  (this->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_003e30f0;
  this->subType = subType;
  this->length = length;
  (this->super_TypeBase).size = length * subType->size;
  (this->super_TypeBase).isGeneric = subType->isGeneric;
  (this->super_TypeBase).hasPointers = subType->hasPointers;
  return;
}

Assistant:

TypeArray(InplaceStr name, TypeBase *subType, long long length): TypeBase(myTypeID, name), subType(subType), length(length)
	{
		size = subType->size * length;

		isGeneric = subType->isGeneric;

		hasPointers = subType->hasPointers;
	}